

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_2_9
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  uint uVar1;
  int32_t *piVar2;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  output_data *local_38;
  
  if (numsamples != 0) {
    local_38 = &this->m_last;
    uVar1 = this->m_sampindex;
    piVar2 = output->data + 2;
    do {
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
      if ((uVar1 & 1) != 0) {
        local_3c = (this->m_last).data[0];
        local_40 = (this->m_last).data[1];
        local_44 = (this->m_last).data[2];
      }
      clock_and_add(this,&local_3c,&local_40,&local_44,2);
      clock_and_add(this,&local_3c,&local_40,&local_44,2);
      clock_and_add(this,&local_3c,&local_40,&local_44,2);
      clock_and_add(this,&local_3c,&local_40,&local_44,2);
      if ((this->m_sampindex & 1) == 0) {
        ssg_engine::clock(this->m_ssg);
        ssg_engine::output(this->m_ssg,local_38);
        local_3c = local_3c + (this->m_last).data[0];
        local_40 = local_40 + (this->m_last).data[1];
        local_44 = local_44 + (this->m_last).data[2];
      }
      *piVar2 = ((local_40 + local_3c + local_44) * 2) / 0x1b;
      uVar1 = this->m_sampindex + 1;
      this->m_sampindex = uVar1;
      piVar2 = piVar2 + 3;
      numsamples = numsamples - 1;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_2_9(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		if (bitfield(m_sampindex, 0) != 0)
			add_last(sum0, sum1, sum2, 1);
		clock_and_add(sum0, sum1, sum2, 2);
		clock_and_add(sum0, sum1, sum2, 2);
		clock_and_add(sum0, sum1, sum2, 2);
		clock_and_add(sum0, sum1, sum2, 2);
		if (bitfield(m_sampindex, 0) == 0)
			clock_and_add(sum0, sum1, sum2, 1);
		write_to_output(output, sum0, sum1, sum2, 9);
	}
}